

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallRuntimeDependencySetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallRuntimeDependencySetGenerator *this,
          string *config)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (this->super_cmInstallGenerator).Destination._M_string_length);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  cmGeneratorExpression::Evaluate
            (__return_storage_ptr__,&local_48,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallRuntimeDependencySetGenerator::GetDestination(
  std::string const& config) const
{
  return cmGeneratorExpression::Evaluate(this->Destination,
                                         this->LocalGenerator, config);
}